

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus_test.cpp
# Opt level: O1

bool __thiscall crn::corpus_tester::test(corpus_tester *this,char *pCmd_line)

{
  error_metrics *peVar1;
  _Base_ptr p_Var2;
  long lVar3;
  double dVar4;
  uint num_channels;
  dynamic_string *pdVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  param_map_const_iterator pVar10;
  image<crnlib::color_quad<unsigned_char,_int>_> *piVar11;
  image_u8 *this_00;
  _Rb_tree_node_base *p_Var12;
  uint uVar13;
  uint uVar14;
  _Base_ptr *pp_Var15;
  ulong uVar16;
  char *pcVar17;
  char **ppcVar18;
  long lVar19;
  file_desc *pfVar20;
  undefined8 unaff_RBP;
  uint num_blocks_y;
  undefined8 uVar21;
  ulong uVar22;
  uint y;
  vector<crnlib::image_utils::error_metrics> metrics [2];
  find_files file_finder;
  image_u8 img;
  pack_params convert_params;
  error_metrics em;
  command_line_params cmd_line_params;
  timer t;
  error_metrics em2;
  mipmapped_texture orig_tex;
  image_u8 orig_img;
  mipmapped_texture tex1;
  image_u8 img2;
  image_u8 img1;
  image_u8 hybrid_img;
  image_u8 b;
  image_u8 a;
  image_u8 o;
  mipmapped_texture tex2;
  undefined8 uStack_428;
  uint local_420;
  uint local_41c;
  vector<crnlib::image_utils::error_metrics> local_418;
  vector<crnlib::image_utils::error_metrics> local_408;
  double local_3f8;
  double local_3f0;
  find_files local_3e8;
  ulong local_3c8;
  uint local_3bc;
  double local_3b8;
  corpus_tester *local_3b0;
  image_u8 *local_3a8;
  image_u8 *local_3a0;
  image_u8 local_398;
  pack_params local_360;
  error_metrics local_328;
  command_line_params local_300;
  _Rb_tree_node_base *local_2c0;
  ulong local_2b8;
  ulong local_2b0;
  ulong local_2a8;
  timer local_2a0;
  error_metrics local_288;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_260 [8];
  long *local_240;
  int local_238;
  image_u8 local_218;
  undefined1 local_1e0 [24];
  undefined8 local_1c8;
  vector<crnlib::mip_level_*> *local_1c0;
  image_u8 local_198;
  image_u8 local_168;
  image<crnlib::color_quad<unsigned_char,_int>_> local_138;
  image<crnlib::color_quad<unsigned_char,_int>_> local_108;
  image<crnlib::color_quad<unsigned_char,_int>_> local_d8;
  image<crnlib::color_quad<unsigned_char,_int>_> local_a8;
  mipmapped_texture local_78;
  
  local_3b0 = this;
  crnlib::console::printf("Command line:\n\"%s\"");
  crnlib::command_line_params::command_line_params(&local_300);
  bVar6 = crnlib::command_line_params::parse(&local_300,pCmd_line,10,test::param_desc_array,true);
  if (bVar6) {
    bVar6 = (_Rb_tree_header *)
            local_300.m_param_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left ==
            &local_300.m_param_map._M_t._M_impl.super__Rb_tree_header;
    uVar22 = CONCAT71((int7)((ulong)unaff_RBP >> 8),bVar6);
    if (bVar6) {
      local_3f8 = 0.0;
      local_3f0 = 0.0;
    }
    else {
      local_3f0 = 0.0;
      local_3f8 = 0.0;
      p_Var12 = local_300.m_param_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        iVar8 = crnlib::dynamic_string::compare((dynamic_string *)(p_Var12 + 1),"in",false);
        if (iVar8 == 0) {
          if (*(int *)&p_Var12[1]._M_right == 0) {
            crnlib::console::error("Must follow /in parameter with a filename!\n");
            goto LAB_001081f3;
          }
          if (*(int *)&p_Var12[1]._M_right == 0) {
            bVar6 = true;
          }
          else {
            uVar16 = 0;
            uStack_428._4_4_ = (uint)uVar22;
            local_2c0 = p_Var12;
            do {
              p_Var2 = local_2c0[1]._M_left;
              local_3e8.m_files.m_p = (file_desc *)0x0;
              local_3e8.m_files.m_size = 0;
              local_3e8.m_files.m_capacity = 0;
              local_3e8.m_last_error = 0;
              pcVar17 = (char *)(&p_Var2->_M_parent)[uVar16 * 2];
              local_2b8 = uVar16;
              pVar10 = crnlib::command_line_params::get_param(&local_300,"deep",0);
              if ((_Base_ptr)pcVar17 == (_Base_ptr)0x0) {
                pcVar17 = "";
              }
              bVar6 = crnlib::find_files::find
                                (&local_3e8,pcVar17,
                                 (_Rb_tree_header *)pVar10._M_node !=
                                 &local_300.m_param_map._M_t._M_impl.super__Rb_tree_header | 4);
              pp_Var15 = &p_Var2->_M_parent + uVar16 * 2;
              if (bVar6) {
                if (local_3e8.m_files.m_size == 0) {
                  pcVar17 = (char *)*pp_Var15;
                  if ((_Base_ptr)pcVar17 == (_Base_ptr)0x0) {
                    pcVar17 = "";
                  }
                  iVar8 = 1;
                  crnlib::console::warning("No files found: %s",pcVar17);
                }
                else {
                  local_260[0].m_u32 = 0xff000000;
                  crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::image
                            (&local_a8,4,4,0xffffffff,
                             (color_quad<unsigned_char,_int> *)&local_260[0].field_0,0xf);
                  local_260[0].m_u32 = 0xff000000;
                  crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::image
                            (&local_d8,4,4,0xffffffff,
                             (color_quad<unsigned_char,_int> *)&local_260[0].field_0,0xf);
                  local_260[0].m_u32 = 0xff000000;
                  crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::image
                            (&local_108,4,4,0xffffffff,
                             (color_quad<unsigned_char,_int> *)&local_260[0].field_0,0xf);
                  bVar6 = crnlib::command_line_params::get_value_as_bool
                                    (&local_300,"perceptual",0,false);
                  crnlib::console::printf("Perceptual mode: %u",(ulong)bVar6);
                  if (local_3e8.m_files.m_size != 0) {
                    local_41c = (uint)!bVar6 + (uint)!bVar6 * 2;
                    uVar22 = 0;
                    do {
                      pfVar20 = local_3e8.m_files.m_p;
                      pcVar17 = local_3e8.m_files.m_p[uVar22].m_fullname.m_pStr;
                      if (pcVar17 == (char *)0x0) {
                        pcVar17 = "";
                      }
                      local_2b0 = uVar22;
                      crnlib::console::printf("-------- Loading image: %s",pcVar17);
                      ppcVar18 = &pfVar20[uVar22].m_fullname.m_pStr;
                      local_398.m_width = 0;
                      local_398.m_height = 0;
                      local_398.m_pitch = 0;
                      local_398.m_total = 0;
                      local_398.m_comp_flags = 0xf;
                      local_398.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
                      local_398.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
                      local_398.m_pixel_buf.m_size = 0;
                      local_398.m_pixel_buf.m_capacity = 0;
                      pcVar17 = *ppcVar18;
                      if (pcVar17 == (char *)0x0) {
                        pcVar17 = "";
                      }
                      bVar7 = crnlib::image_utils::read_from_file(&local_398,pcVar17,0);
                      if (bVar7) {
                        pVar10 = crnlib::command_line_params::get_param(&local_300,"alpha",0);
                        if (((_Rb_tree_header *)pVar10._M_node ==
                             &local_300.m_param_map._M_t._M_impl.super__Rb_tree_header) &&
                           ((local_398.m_comp_flags & 8) != 0)) {
                          if (local_398.m_height != 0) {
                            uVar9 = 0;
                            do {
                              if (local_398.m_width != 0) {
                                uVar13 = 0;
                                do {
                                  local_398.m_pPixels[local_398.m_pitch * uVar9 + uVar13].field_0.
                                  field_0.a = 0xff;
                                  uVar13 = uVar13 + 1;
                                } while (uVar13 < local_398.m_width);
                              }
                              uVar9 = uVar9 + 1;
                            } while (uVar9 < local_398.m_height);
                          }
                          local_398.m_comp_flags = local_398.m_comp_flags & 0xfffffff7;
                        }
                        crnlib::mipmapped_texture::mipmapped_texture
                                  ((mipmapped_texture *)&local_260[0].field_0);
                        piVar11 = (image<crnlib::color_quad<unsigned_char,_int>_> *)
                                  crnlib::crnlib_malloc(0x30);
                        crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::image
                                  (piVar11,&local_398);
                        crnlib::mipmapped_texture::assign
                                  ((mipmapped_texture *)&local_260[0].field_0,piVar11,
                                   PIXEL_FMT_INVALID,cDefaultOrientationFlags);
                        pVar10 = crnlib::command_line_params::get_param(&local_300,"nomips",0);
                        if ((_Rb_tree_header *)pVar10._M_node ==
                            &local_300.m_param_map._M_t._M_impl.super__Rb_tree_header) {
                          local_1e0._0_8_ = "kaiser";
                          local_1e0._12_8_ = 0x3fe000003f666666;
                          local_1e0[0x14] = true;
                          local_1c8._0_4_ = cCompFlagRValid;
                          local_1c8._4_4_ = PIXEL_FMT_INVALID;
                          local_1e0[8] = false;
                          local_1e0[9] = true;
                          local_1e0[10] = false;
                          local_1e0[0xb] = false;
                          crnlib::console::printf("Generating mipmaps");
                          bVar7 = crnlib::mipmapped_texture::generate_mipmaps
                                            ((mipmapped_texture *)&local_260[0].field_0,
                                             (generate_mipmap_params *)local_1e0,false);
                          if (bVar7) goto LAB_001077ba;
                          crnlib::console::error("Mipmap generation failed!");
                          iVar8 = 1;
                          if (bVar7) goto LAB_001077ba;
                        }
                        else {
LAB_001077ba:
                          crnlib::console::printf("Compress 1");
                          crnlib::mipmapped_texture::mipmapped_texture
                                    ((mipmapped_texture *)local_1e0,
                                     (mipmapped_texture *)&local_260[0].field_0);
                          local_360.m_quality = cCRNDXTQualityUber;
                          local_360.m_compressor = cCRNDXTCompressorCRN;
                          local_360.m_perceptual = true;
                          local_360.m_dithering = false;
                          local_360.m_grayscale_sampling = false;
                          local_360.m_use_both_block_types = true;
                          local_360.m_endpoint_caching = true;
                          local_360.m_pProgress_callback = (progress_callback_func)0x0;
                          local_360.m_pProgress_callback_user_data_ptr = (void *)0x0;
                          local_360.m_dxt1a_alpha_threshold = 0x80;
                          local_360.m_num_helper_threads = 0;
                          local_360.m_progress_start = 0;
                          local_360.m_progress_range = 100;
                          local_360.m_use_transparent_indices_for_black = false;
                          local_360.m_pTask_pool = (task_pool *)0x0;
                          local_360.m_endpoint_caching =
                               crnlib::command_line_params::get_value_as_bool
                                         (&local_300,"endpointcaching",0,false);
                          local_360.m_quality = cCRNDXTQualityNormal;
                          local_360.m_compressor = cCRNDXTCompressorCRN;
                          local_360.m_perceptual = bVar6;
                          bVar7 = crnlib::command_line_params::get_value_as_bool
                                            (&local_300,"multithreaded",0,true);
                          uVar14 = crnlib::g_number_of_processors - 1;
                          if (!bVar7) {
                            uVar14 = 0;
                          }
                          local_360.m_num_helper_threads = uVar14;
                          local_360.m_pProgress_callback = progress_callback;
                          crnlib::timer::timer(&local_2a0);
                          crnlib::timer::start(&local_2a0);
                          bVar7 = crnlib::mipmapped_texture::convert
                                            ((mipmapped_texture *)local_1e0,PIXEL_FMT_ETC1,false,
                                             &local_360);
                          if (bVar7) {
                            local_3b8 = crnlib::timer::get_elapsed_secs(&local_2a0);
                            crnlib::console::printf("Elapsed time: %3.3f",SUB84(local_3b8,0));
                            crnlib::console::printf("Compress 2");
                            crnlib::mipmapped_texture::mipmapped_texture
                                      (&local_78,(mipmapped_texture *)&local_260[0].field_0);
                            local_360.m_endpoint_caching = false;
                            local_360.m_quality = cCRNDXTQualitySuperFast;
                            local_360.m_compressor = cCRNDXTCompressorCRN;
                            crnlib::timer::start(&local_2a0);
                            bVar7 = crnlib::mipmapped_texture::convert
                                              (&local_78,PIXEL_FMT_ETC1,false,&local_360);
                            if (bVar7) {
                              dVar4 = crnlib::timer::get_elapsed_secs(&local_2a0);
                              crnlib::console::printf("Elapsed time: %3.3f",SUB84(dVar4,0));
                              local_218.m_width = 0xff000000;
                              uVar21 = 0xf;
                              crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::image
                                        (&local_138,local_398.m_width,local_398.m_height,0xffffffff,
                                         (color_quad<unsigned_char,_int> *)&local_218,0xf);
                              local_3f8 = local_3f8 + dVar4;
                              uVar22 = 0;
                              while( true ) {
                                if (local_238 == 0) {
                                  uVar16 = 0;
                                }
                                else {
                                  uVar16 = (ulong)(uint)local_240[1];
                                }
                                if (uVar16 <= uVar22) break;
                                local_218.m_width = 0;
                                local_218.m_height = 0;
                                local_218.m_pitch = 0;
                                local_218.m_total = 0;
                                local_218.m_comp_flags = 0xf;
                                local_218.m_pixel_buf.m_size = 0;
                                local_218.m_pixel_buf.m_capacity = 0;
                                local_218.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
                                local_218.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
                                local_168.m_width = 0;
                                local_168.m_height = 0;
                                local_168.m_pitch = 0;
                                local_168.m_total = 0;
                                local_168.m_comp_flags = 0xf;
                                local_168.m_pixel_buf.m_size = 0;
                                local_168.m_pixel_buf.m_capacity = 0;
                                local_168.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
                                local_168.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
                                local_198.m_width = 0;
                                local_198.m_height = 0;
                                local_198.m_pitch = 0;
                                local_198.m_total = 0;
                                local_198.m_comp_flags = 0xf;
                                local_198.m_pixel_buf.m_size = 0;
                                local_198.m_pixel_buf.m_capacity = 0;
                                local_198.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
                                local_198.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
                                this_00 = crnlib::mip_level::get_unpacked_image
                                                    (*(mip_level **)(*local_240 + uVar22 * 8),
                                                     &local_218,3);
                                local_3a0 = crnlib::mip_level::get_unpacked_image
                                                      (local_1c0->m_p[uVar22],&local_168,3);
                                local_2a8 = uVar22;
                                local_3a8 = crnlib::mip_level::get_unpacked_image
                                                      ((local_78.m_faces.m_p)->m_p[uVar22],
                                                       &local_198,3);
                                num_blocks_y = (uint)uVar21;
                                local_3bc = this_00->m_width + 3;
                                local_408.m_p = (error_metrics *)0x0;
                                local_408.m_size = 0;
                                local_408.m_capacity = 0;
                                local_418.m_p = (error_metrics *)0x0;
                                local_418.m_size = 0;
                                local_418.m_capacity = 0;
                                uVar9 = this_00->m_height + 3;
                                uVar13 = local_3bc >> 2;
                                local_420 = uVar9 >> 2;
                                if (3 < uVar9) {
                                  local_3c8 = 0;
                                  do {
                                    if (3 < local_3bc) {
                                      y = (int)local_3c8 * 4;
                                      uVar14 = 0;
                                      uVar9 = uVar13;
                                      do {
                                        crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::
                                        extract_block(this_00,local_a8.m_pPixels,uVar14,y,4,4,false)
                                        ;
                                        crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::
                                        extract_block(local_3a0,local_d8.m_pPixels,uVar14,y,4,4,
                                                      false);
                                        crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::
                                        extract_block(local_3a8,local_108.m_pPixels,uVar14,y,4,4,
                                                      false);
                                        num_channels = local_41c;
                                        local_328.mMeanSquared = 0.0;
                                        local_328.mRootMeanSquared = 0.0;
                                        local_328.mMax = 0;
                                        local_328._4_4_ = 0;
                                        local_328.mMean = 0.0;
                                        local_328.mPeakSNR = 0.0;
                                        crnlib::image_utils::error_metrics::compute
                                                  (&local_328,&local_a8,&local_d8,0,local_41c,true);
                                        local_288.mMeanSquared = 0.0;
                                        local_288.mRootMeanSquared = 0.0;
                                        local_288.mMax = 0;
                                        local_288._4_4_ = 0;
                                        local_288.mMean = 0.0;
                                        local_288.mPeakSNR = 0.0;
                                        uVar21 = 1;
                                        crnlib::image_utils::error_metrics::compute
                                                  (&local_288,&local_a8,&local_108,0,num_channels,
                                                   true);
                                        if (local_418.m_capacity <= local_418.m_size) {
                                          uVar21 = 0;
                                          crnlib::elemental_vector::increase_capacity
                                                    ((elemental_vector *)&local_418,
                                                     local_418.m_size + 1,true,0x28,
                                                     crnlib::
                                                  vector<crnlib::image_utils::error_metrics>::
                                                  object_mover,false);
                                        }
                                        uVar22 = local_418._8_8_ & 0xffffffff;
                                        local_418.m_p[uVar22].mPeakSNR = local_328.mPeakSNR;
                                        local_418.m_p[uVar22].mMeanSquared = local_328.mMeanSquared;
                                        (&local_418.m_p[uVar22].mMeanSquared)[1] =
                                             local_328.mRootMeanSquared;
                                        peVar1 = local_418.m_p + uVar22;
                                        peVar1->mMax = local_328.mMax;
                                        *(undefined4 *)&peVar1->field_0x4 = local_328._4_4_;
                                        peVar1->mMean = local_328.mMean;
                                        local_418.m_size = local_418.m_size + 1;
                                        if (local_408.m_capacity <= local_408.m_size) {
                                          uVar21 = 0;
                                          crnlib::elemental_vector::increase_capacity
                                                    ((elemental_vector *)&local_408,
                                                     local_408.m_size + 1,true,0x28,
                                                     crnlib::
                                                  vector<crnlib::image_utils::error_metrics>::
                                                  object_mover,false);
                                        }
                                        uVar22 = local_408._8_8_ & 0xffffffff;
                                        local_408.m_p[uVar22].mPeakSNR = local_288.mPeakSNR;
                                        local_408.m_p[uVar22].mMeanSquared = local_288.mMeanSquared;
                                        (&local_408.m_p[uVar22].mMeanSquared)[1] =
                                             local_288.mRootMeanSquared;
                                        peVar1 = local_408.m_p + uVar22;
                                        peVar1->mMax = local_288.mMax;
                                        *(undefined4 *)&peVar1->field_0x4 = local_288._4_4_;
                                        peVar1->mMean = local_288.mMean;
                                        local_408.m_size = local_408.m_size + 1;
                                        piVar11 = &local_d8;
                                        if (local_328.mPeakSNR < local_288.mPeakSNR) {
                                          add_bad_block(local_3b0,&local_a8);
                                          piVar11 = &local_108;
                                        }
                                        crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::blit
                                                  (&local_138,uVar14,y,piVar11);
                                        uVar14 = uVar14 + 4;
                                        uVar9 = uVar9 - 1;
                                      } while (uVar9 != 0);
                                    }
                                    num_blocks_y = (uint)uVar21;
                                    uVar9 = (int)local_3c8 + 1;
                                    local_3c8 = (ulong)uVar9;
                                  } while (uVar9 != local_420);
                                }
                                pVar10 = crnlib::command_line_params::get_param
                                                   (&local_300,"writehybrid",0);
                                uVar22 = local_2a8;
                                if ((_Rb_tree_header *)pVar10._M_node !=
                                    &local_300.m_param_map._M_t._M_impl.super__Rb_tree_header) {
                                  crnlib::image_utils::write_to_file("hybrid.tga",&local_138,1,-1);
                                }
                                uVar9 = local_420;
                                crnlib::console::printf
                                          ("---- Mip level: %u, Total blocks: %ux%u, %u",
                                           uVar22 & 0xffffffff,(ulong)uVar13,(ulong)local_420,
                                           (ulong)(local_420 * uVar13));
                                pcVar17 = "Compressor 1:";
                                crnlib::console::printf("Compressor 1:");
                                print_metric_stats((corpus_tester *)pcVar17,&local_418,uVar13,uVar9)
                                ;
                                pcVar17 = "Compressor 2:";
                                crnlib::console::printf("Compressor 2:");
                                print_metric_stats((corpus_tester *)pcVar17,&local_408,uVar13,uVar9)
                                ;
                                pcVar17 = "Compressor 1 vs. 2:";
                                crnlib::console::printf("Compressor 1 vs. 2:");
                                print_comparative_metric_stats
                                          ((corpus_tester *)pcVar17,&local_300,&local_418,&local_408
                                           ,uVar13,num_blocks_y);
                                uVar14 = local_41c;
                                local_328.mMeanSquared = 0.0;
                                local_328.mRootMeanSquared = 0.0;
                                local_328.mMax = 0;
                                local_328._4_4_ = 0;
                                local_328.mMean = 0.0;
                                local_328.mPeakSNR = 0.0;
                                crnlib::image_utils::error_metrics::compute
                                          (&local_328,this_00,local_3a0,0,local_41c,true);
                                crnlib::image_utils::error_metrics::print
                                          (&local_328,"Compressor 1: ");
                                crnlib::image_utils::error_metrics::compute
                                          (&local_328,this_00,local_3a8,0,uVar14,true);
                                crnlib::image_utils::error_metrics::print
                                          (&local_328,"Compressor 2: ");
                                uVar21 = 1;
                                crnlib::image_utils::error_metrics::compute
                                          (&local_328,this_00,&local_138,0,uVar14,true);
                                crnlib::image_utils::error_metrics::print
                                          (&local_328,"Best of Both: ");
                                lVar19 = 0x20;
                                do {
                                  if (*(void **)((long)&uStack_428 + lVar19) != (void *)0x0) {
                                    crnlib::crnlib_free(*(void **)((long)&uStack_428 + lVar19));
                                  }
                                  lVar19 = lVar19 + -0x10;
                                } while (lVar19 != 0);
                                if (local_198.m_pixel_buf.m_p !=
                                    (color_quad<unsigned_char,_int> *)0x0) {
                                  crnlib::crnlib_free(local_198.m_pixel_buf.m_p);
                                }
                                if (local_168.m_pixel_buf.m_p !=
                                    (color_quad<unsigned_char,_int> *)0x0) {
                                  crnlib::crnlib_free(local_168.m_pixel_buf.m_p);
                                }
                                if (local_218.m_pixel_buf.m_p !=
                                    (color_quad<unsigned_char,_int> *)0x0) {
                                  crnlib::crnlib_free(local_218.m_pixel_buf.m_p);
                                }
                                uVar22 = uVar22 + 1;
                              }
                              if (local_138.m_pixel_buf.m_p != (color_quad<unsigned_char,_int> *)0x0
                                 ) {
                                crnlib::crnlib_free(local_138.m_pixel_buf.m_p);
                              }
                              iVar8 = 0;
                            }
                            else {
                              iVar8 = 1;
                              crnlib::console::error("Texture conversion failed!");
                            }
                            local_3f0 = local_3f0 + local_3b8;
                            crnlib::mipmapped_texture::~mipmapped_texture(&local_78);
                          }
                          else {
                            iVar8 = 1;
                            crnlib::console::error("Texture conversion failed!");
                          }
                          crnlib::mipmapped_texture::~mipmapped_texture
                                    ((mipmapped_texture *)local_1e0);
                        }
                        crnlib::mipmapped_texture::~mipmapped_texture
                                  ((mipmapped_texture *)&local_260[0].field_0);
                      }
                      else {
                        pcVar17 = *ppcVar18;
                        if (pcVar17 == (char *)0x0) {
                          pcVar17 = "";
                        }
                        iVar8 = 10;
                        crnlib::console::warning("Failed loading image file: %s",pcVar17);
                      }
                      if (local_398.m_pixel_buf.m_p != (color_quad<unsigned_char,_int> *)0x0) {
                        crnlib::crnlib_free(local_398.m_pixel_buf.m_p);
                      }
                      if ((iVar8 != 10) && (iVar8 != 0)) {
                        uVar22 = (ulong)uStack_428._4_4_;
                        goto LAB_001080d9;
                      }
                      uVar22 = local_2b0 + 1;
                    } while (uVar22 < (local_3e8.m_files._8_8_ & 0xffffffff));
                    uVar22 = (ulong)uStack_428._4_4_;
                  }
                  iVar8 = 8;
LAB_001080d9:
                  if (iVar8 == 8) {
                    iVar8 = 0;
                  }
                  if (local_108.m_pixel_buf.m_p != (color_quad<unsigned_char,_int> *)0x0) {
                    crnlib::crnlib_free(local_108.m_pixel_buf.m_p);
                  }
                  if (local_d8.m_pixel_buf.m_p != (color_quad<unsigned_char,_int> *)0x0) {
                    crnlib::crnlib_free(local_d8.m_pixel_buf.m_p);
                  }
                  if (local_a8.m_pixel_buf.m_p != (color_quad<unsigned_char,_int> *)0x0) {
                    crnlib::crnlib_free(local_a8.m_pixel_buf.m_p);
                  }
                }
              }
              else {
                pcVar17 = (char *)*pp_Var15;
                if ((_Base_ptr)pcVar17 == (_Base_ptr)0x0) {
                  pcVar17 = "";
                }
                iVar8 = 7;
                crnlib::console::warning("Failed finding files: %s",pcVar17);
              }
              if (local_3e8.m_files.m_p != (file_desc *)0x0) {
                if ((local_3e8.m_files._8_8_ & 0xffffffff) != 0) {
                  lVar19 = (local_3e8.m_files._8_8_ & 0xffffffff) * 0x48;
                  pfVar20 = local_3e8.m_files.m_p;
                  do {
                    crnlib::find_files::file_desc::~file_desc(pfVar20);
                    pfVar20 = pfVar20 + 1;
                    lVar19 = lVar19 + -0x48;
                  } while (lVar19 != 0);
                }
                crnlib::crnlib_free(local_3e8.m_files.m_p);
              }
              if ((iVar8 != 7) && (iVar8 != 0)) goto LAB_0010818b;
              uVar16 = local_2b8 + 1;
            } while (uVar16 < *(uint *)&local_2c0[1]._M_right);
            iVar8 = 5;
LAB_0010818b:
            bVar6 = iVar8 == 5;
            p_Var12 = local_2c0;
          }
          if (!bVar6) goto LAB_001081f3;
        }
        p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
        bVar6 = (_Rb_tree_header *)p_Var12 ==
                &local_300.m_param_map._M_t._M_impl.super__Rb_tree_header;
        uVar22 = CONCAT71((int7)(uVar22 >> 8),bVar6);
      } while (!bVar6);
    }
    flush_bad_blocks(local_3b0);
    crnlib::console::printf("Total times: %4.3f vs. %4.3f",SUB84(local_3f0,0),SUB84(local_3f8,0));
  }
  else {
    uVar22 = 0;
  }
LAB_001081f3:
  std::
  _Rb_tree<crnlib::dynamic_string,_std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>,_std::_Select1st<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>,_std::less<crnlib::dynamic_string>,_std::allocator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>_>
  ::~_Rb_tree(&local_300.m_param_map._M_t);
  pdVar5 = local_300.m_params.m_p;
  if (local_300.m_params.m_p != (dynamic_string *)0x0) {
    if ((ulong)local_300.m_params.m_size != 0) {
      lVar19 = 0;
      do {
        lVar3 = *(long *)((long)&pdVar5->m_pStr + lVar19);
        if ((lVar3 != 0) && ((*(uint *)(lVar3 + -8) ^ *(uint *)(lVar3 + -4)) == 0xffffffff)) {
          crnlib::crnlib_free((void *)(lVar3 + -0x10));
        }
        lVar19 = lVar19 + 0x10;
      } while ((ulong)local_300.m_params.m_size << 4 != lVar19);
    }
    crnlib::crnlib_free(local_300.m_params.m_p);
  }
  return (bool)((byte)uVar22 & 1);
}

Assistant:

bool corpus_tester::test(const char* pCmd_line)
    {
        console::printf("Command line:\n\"%s\"", pCmd_line);

        static const command_line_params::param_desc param_desc_array[] =
        {
            { "corpus_test", 0, false },
            { "in", 1, true },
            { "deep", 0, false },
            { "alpha", 0, false },
            { "nomips", 0, false },
            { "perceptual", 0, false },
            { "endpointcaching", 0, false },
            { "multithreaded", 0, false },
            { "writehybrid", 0, false },
            { "nobadblocks", 0, false },
        };

        command_line_params cmd_line_params;
        if (!cmd_line_params.parse(pCmd_line, CRNLIB_ARRAY_SIZE(param_desc_array), param_desc_array, true))
        {
            return false;
        }

        double total_time1 = 0, total_time2 = 0;

        command_line_params::param_map_const_iterator it = cmd_line_params.begin();
        for (; it != cmd_line_params.end(); ++it)
        {
            if (it->first != "in")
            {
                continue;
            }
            if (it->second.m_values.empty())
            {
                console::error("Must follow /in parameter with a filename!\n");
                return false;
            }

            for (uint in_value_index = 0; in_value_index < it->second.m_values.size(); in_value_index++)
            {
                const dynamic_string& filespec = it->second.m_values[in_value_index];

                find_files file_finder;
                if (!file_finder.find(filespec.get_ptr(), find_files::cFlagAllowFiles | (cmd_line_params.has_key("deep") ? find_files::cFlagRecursive : 0)))
                {
                    console::warning("Failed finding files: %s", filespec.get_ptr());
                    continue;
                }

                if (file_finder.get_files().empty())
                {
                    console::warning("No files found: %s", filespec.get_ptr());
                    return false;
                }

                const find_files::file_desc_vec& files = file_finder.get_files();

                image_u8 o(4, 4), a(4, 4), b(4, 4);

                uint first_channel = 0;
                uint num_channels = 3;
                bool perceptual = cmd_line_params.get_value_as_bool("perceptual", false);
                if (perceptual)
                {
                    first_channel = 0;
                    num_channels = 0;
                }
                console::printf("Perceptual mode: %u", perceptual);

                for (uint file_index = 0; file_index < files.size(); file_index++)
                {
                    const find_files::file_desc& file_desc = files[file_index];

                    console::printf("-------- Loading image: %s", file_desc.m_fullname.get_ptr());

                    image_u8 img;
                    if (!image_utils::read_from_file(img, file_desc.m_fullname.get_ptr(), 0))
                    {
                        console::warning("Failed loading image file: %s", file_desc.m_fullname.get_ptr());
                        continue;
                    }

                    if ((!cmd_line_params.has_key("alpha")) && img.is_component_valid(3))
                    {
                        for (uint y = 0; y < img.get_height(); y++)
                        {
                            for (uint x = 0; x < img.get_width(); x++)
                            {
                                img(x, y).a = 255;
                            }
                        }

                        img.set_component_valid(3, false);
                    }

                    mipmapped_texture orig_tex;
                    orig_tex.assign(crnlib_new<image_u8>(img));

                    if (!cmd_line_params.has_key("nomips"))
                    {
                        mipmapped_texture::generate_mipmap_params genmip_params;
                        genmip_params.m_srgb = true;

                        console::printf("Generating mipmaps");

                        if (!orig_tex.generate_mipmaps(genmip_params, false))
                        {
                            console::error("Mipmap generation failed!");
                            return false;
                        }
                    }

                    console::printf("Compress 1");

                    mipmapped_texture tex1(orig_tex);
                    dxt_image::pack_params convert_params;
                    convert_params.m_endpoint_caching = cmd_line_params.get_value_as_bool("endpointcaching", 0, false);
                    convert_params.m_compressor = cCRNDXTCompressorCRN;
                    convert_params.m_quality = cCRNDXTQualityNormal;
                    convert_params.m_perceptual = perceptual;
                    convert_params.m_num_helper_threads = cmd_line_params.get_value_as_bool("multithreaded", 0, true) ? (g_number_of_processors - 1) : 0;
                    convert_params.m_pProgress_callback = progress_callback;
                    timer t;
                    t.start();
                    if (!tex1.convert(PIXEL_FMT_ETC1, false, convert_params))
                    {
                        console::error("Texture conversion failed!");
                        return false;
                    }
                    double time1 = t.get_elapsed_secs();
                    total_time1 += time1;
                    console::printf("Elapsed time: %3.3f", time1);

                    console::printf("Compress 2");

                    mipmapped_texture tex2(orig_tex);
                    convert_params.m_endpoint_caching = false;
                    convert_params.m_compressor = cCRNDXTCompressorCRN;
                    convert_params.m_quality = cCRNDXTQualitySuperFast;
                    t.start();
                    if (!tex2.convert(PIXEL_FMT_ETC1, false, convert_params))
                    {
                        console::error("Texture conversion failed!");
                        return false;
                    }
                    double time2 = t.get_elapsed_secs();
                    total_time2 += time2;
                    console::printf("Elapsed time: %3.3f", time2);

                    image_u8 hybrid_img(img.get_width(), img.get_height());

                    for (uint l = 0; l < orig_tex.get_num_levels(); l++)
                    {
                        image_u8 orig_img, img1, img2;

                        image_u8* pOrig = orig_tex.get_level(0, l)->get_unpacked_image(orig_img, cUnpackFlagUncook | cUnpackFlagUnflip);
                        image_u8* pImg1 = tex1.get_level(0, l)->get_unpacked_image(img1, cUnpackFlagUncook | cUnpackFlagUnflip);
                        image_u8* pImg2 = tex2.get_level(0, l)->get_unpacked_image(img2, cUnpackFlagUncook | cUnpackFlagUnflip);

                        const uint num_blocks_x = pOrig->get_block_width(4);
                        const uint num_blocks_y = pOrig->get_block_height(4);

                        crnlib::vector<image_utils::error_metrics> metrics[2];

                        for (uint by = 0; by < num_blocks_y; by++)
                        {
                            for (uint bx = 0; bx < num_blocks_x; bx++)
                            {
                                pOrig->extract_block(o.get_ptr(), bx * 4, by * 4, 4, 4);
                                pImg1->extract_block(a.get_ptr(), bx * 4, by * 4, 4, 4);
                                pImg2->extract_block(b.get_ptr(), bx * 4, by * 4, 4, 4);

                                image_utils::error_metrics em1;
                                em1.compute(o, a, first_channel, num_channels);

                                image_utils::error_metrics em2;
                                em2.compute(o, b, first_channel, num_channels);

                                metrics[0].push_back(em1);
                                metrics[1].push_back(em2);

                                if (em1.mPeakSNR < em2.mPeakSNR)
                                {
                                    add_bad_block(o);

                                    hybrid_img.blit(bx * 4, by * 4, b);
                                }
                                else
                                {
                                    hybrid_img.blit(bx * 4, by * 4, a);
                                }
                            }
                        }

                        if (cmd_line_params.has_key("writehybrid"))
                        {
                            image_utils::write_to_file("hybrid.tga", hybrid_img, image_utils::cWriteFlagIgnoreAlpha);
                        }

                        console::printf("---- Mip level: %u, Total blocks: %ux%u, %u", l, num_blocks_x, num_blocks_y, num_blocks_x * num_blocks_y);

                        console::printf("Compressor 1:");
                        print_metric_stats(metrics[0], num_blocks_x, num_blocks_y);

                        console::printf("Compressor 2:");
                        print_metric_stats(metrics[1], num_blocks_x, num_blocks_y);

                        console::printf("Compressor 1 vs. 2:");
                        print_comparative_metric_stats(cmd_line_params, metrics[0], metrics[1], num_blocks_x, num_blocks_y);

                        image_utils::error_metrics em;

                        em.compute(*pOrig, *pImg1, 0, perceptual ? 0 : 3);
                        em.print("Compressor 1: ");

                        em.compute(*pOrig, *pImg2, 0, perceptual ? 0 : 3);
                        em.print("Compressor 2: ");

                        em.compute(*pOrig, hybrid_img, 0, perceptual ? 0 : 3);
                        em.print("Best of Both: ");
                    }
                }
            } // file_index
        }

        flush_bad_blocks();

        console::printf("Total times: %4.3f vs. %4.3f", total_time1, total_time2);

        return true;
    }